

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

string * __thiscall
pbrt::PaddedSobolSampler::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PaddedSobolSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,pbrt::RandomizeStrategy_const&>
            (__return_storage_ptr__,
             "[ PaddedSobolSampler pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d randomizeStrategy: %s ]"
             ,&this->pixel,&this->sampleIndex,&this->dimension,&this->samplesPerPixel,
             &this->randomizeStrategy);
  return __return_storage_ptr__;
}

Assistant:

std::string PaddedSobolSampler::ToString() const {
    return StringPrintf("[ PaddedSobolSampler pixel: %s sampleIndex: %d dimension: %d "
                        "samplesPerPixel: %d randomizeStrategy: %s ]",
                        pixel, sampleIndex, dimension, samplesPerPixel,
                        randomizeStrategy);
}